

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::
       list_caster<std::vector<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,std::allocator<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>>,std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
       ::
       cast<std::vector<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,std::allocator<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>>>
                 (vector<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::allocator<std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>_>_>
                  *src,return_value_policy policy,handle parent)

{
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *puVar1;
  handle hVar2;
  long lVar3;
  PyObject *tmp;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *src_00;
  list l;
  object value_;
  
  list::list(&l,(*(long *)(src + 8) - *(long *)src) / 0x38);
  src_00 = *(unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> **)src
  ;
  puVar1 = *(unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> **)
            (src + 8);
  lVar3 = 0;
  do {
    hVar2.m_ptr = (PyObject *)l.super_object.super_handle.m_ptr;
    if (src_00 == puVar1) {
      l.super_object.super_handle.m_ptr = (object)(handle)0x0;
      goto LAB_001dd5bf;
    }
    hVar2 = set_caster<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,long>
            ::
            cast<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
                      (src_00,policy,parent);
    value_.super_handle = hVar2;
    if (hVar2.m_ptr != (PyObject *)0x0) {
      value_.super_handle.m_ptr = (handle)(PyObject *)0x0;
      *(PyObject **)(*(long *)((long)l.super_object.super_handle.m_ptr + 0x18) + lVar3 * 8) =
           hVar2.m_ptr;
      lVar3 = lVar3 + 1;
    }
    object::~object(&value_);
    src_00 = src_00 + 1;
  } while (hVar2.m_ptr != (PyObject *)0x0);
  hVar2.m_ptr = (PyObject *)0x0;
LAB_001dd5bf:
  object::~object(&l.super_object);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }